

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::CalcConstraintsVelocityError
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,VectorNd *err,
               bool update_kinematics)

{
  long *plVar1;
  uint uVar2;
  
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),update_kinematics);
  uVar2 = 0;
  while( true ) {
    if ((ulong)(*(long *)(CS + 0xd0) - *(long *)(CS + 200) >> 4) <= (ulong)uVar2) break;
    plVar1 = *(long **)(*(long *)(CS + 200) + (ulong)uVar2 * 0x10);
    (**(code **)(*plVar1 + 0x20))(0,plVar1,model,Q,QDot,CS + 0x198,err,CS + 0x620,update_kinematics)
    ;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsVelocityError (
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  Math::VectorNd& err,
  bool update_kinematics
)
{


  CalcConstraintsJacobian (model, Q, CS, CS.G, update_kinematics);

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcVelocityError(model,0,Q,QDot,CS.G,err,CS.cache,
                                         update_kinematics);
  }

}